

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstWalker.cpp
# Opt level: O0

void __thiscall
AstWalker::visitFunctionDeclarationExpressionAstNode
          (AstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  bool bVar1;
  __shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  shared_ptr<StatementAstNode> *statement;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  *__range1;
  FunctionDeclarationExpressionAstNode *node_local;
  AstWalker *this_local;
  
  (*this->_vptr_AstWalker[0x1f])(this,node);
  __end1 = std::
           vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           ::begin(&node->statements);
  statement = (shared_ptr<StatementAstNode> *)
              std::
              vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
              ::end(&node->statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<StatementAstNode>_*,_std::vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>_>
                                *)&statement);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<const_std::shared_ptr<StatementAstNode>_*,_std::vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>_>
               ::operator*(&__end1)->
               super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    (*this->_vptr_AstWalker[2])(this,peVar2);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<StatementAstNode>_*,_std::vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>_>
    ::operator++(&__end1);
  }
  (*this->_vptr_AstWalker[0x2e])(this,node);
  return;
}

Assistant:

void AstWalker::visitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept {
  this->onEnterFunctionDeclarationExpressionAstNode(node);
  for (auto & statement : node->statements) {
    this->visitStatementAstNode(statement.get());
  }
  this->onExitFunctionDeclarationExpressionAstNode(node);
}